

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_curves.cpp
# Opt level: O1

void __thiscall
agg::curve4_div::bezier
          (curve4_div *this,double x1,double y1,double x2,double y2,double x3,double y3,double x4,
          double y4)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar3 = *(uint *)(this + 0x28) >> 6;
  if (*(uint *)(this + 0x2c) <= uVar3) {
    pod_bvector<agg::point_base<double>,_6U>::allocate_block
              ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x28),uVar3);
  }
  lVar1 = *(long *)(*(long *)(this + 0x38) + (ulong)uVar3 * 8);
  uVar3 = *(uint *)(this + 0x28);
  uVar2 = (ulong)((uVar3 & 0x3f) << 4);
  *(double *)(lVar1 + uVar2) = x1;
  *(double *)(lVar1 + 8 + uVar2) = y1;
  *(uint *)(this + 0x28) = uVar3 + 1;
  recursive_bezier(this,x1,y1,x2,y2,x3,y3,x4,y4,0);
  uVar3 = *(uint *)(this + 0x28) >> 6;
  if (*(uint *)(this + 0x2c) <= uVar3) {
    pod_bvector<agg::point_base<double>,_6U>::allocate_block
              ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x28),uVar3);
  }
  lVar1 = *(long *)(*(long *)(this + 0x38) + (ulong)uVar3 * 8);
  uVar3 = *(uint *)(this + 0x28);
  uVar2 = (ulong)((uVar3 & 0x3f) << 4);
  *(double *)(lVar1 + uVar2) = x4;
  *(double *)(lVar1 + 8 + uVar2) = y4;
  *(uint *)(this + 0x28) = uVar3 + 1;
  return;
}

Assistant:

void curve4_div::bezier(double x1, double y1, 
                            double x2, double y2, 
                            double x3, double y3, 
                            double x4, double y4)
    {
        m_points.add(point_d(x1, y1));
        recursive_bezier(x1, y1, x2, y2, x3, y3, x4, y4, 0);
        m_points.add(point_d(x4, y4));
    }